

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O2

void __thiscall
TTD::RuntimeContextInfo::EnqueueNewFunctionBodyObject
          (RuntimeContextInfo *this,RecyclableObject *parent,FunctionBody *fbody,char16 *name)

{
  bool bVar1;
  TTAutoString *str;
  HeapAllocator *this_00;
  TTAutoString *this_01;
  undefined **local_68;
  TTAutoString *fpath;
  size_t local_58;
  char *local_50;
  DWORD local_48;
  RecyclableObject *local_40;
  RecyclableObject *parent_local;
  FunctionBody *fbody_local;
  
  local_40 = parent;
  parent_local = (RecyclableObject *)fbody;
  bVar1 = JsUtil::
          BaseDictionary<Js::FunctionBody_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::ContainsKey(&this->m_coreBodyToPathMap,(FunctionBody **)&parent_local);
  if (!bVar1) {
    Js::FunctionProxy::EnsureDeserialized((FunctionProxy *)parent_local);
    str = JsUtil::
          BaseDictionary<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::Item(&this->m_coreObjToPathMap,&local_40);
    local_68 = &UtilSupport::TTAutoString::typeinfo;
    fpath = (TTAutoString *)0x0;
    local_58 = 0xffffffffffffffff;
    local_50 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTRuntimeInfoTracker.cpp"
    ;
    local_48 = 0x3a9;
    this_00 = Memory::HeapAllocator::TrackAllocInfo
                        (&Memory::HeapAllocator::Instance,(TrackAllocData *)&stack0xffffffffffffff98
                        );
    this_01 = (TTAutoString *)Memory::HeapAllocator::AllocT<true>(this_00,0x18);
    UtilSupport::TTAutoString::TTAutoString(this_01,str);
    local_68 = (undefined **)this_01;
    UtilSupport::TTAutoString::Append(this_01,L".",0,0xffffffffffffffff);
    UtilSupport::TTAutoString::Append(this_01,name,0,0xffffffffffffffff);
    JsUtil::
    BaseDictionary<Js::FunctionBody*,TTD::UtilSupport::TTAutoString*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<Js::FunctionBody*,TTD::UtilSupport::TTAutoString*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
              ((BaseDictionary<Js::FunctionBody*,TTD::UtilSupport::TTAutoString*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)&this->m_coreBodyToPathMap,(FunctionBody **)&parent_local,
               (TTAutoString **)&stack0xffffffffffffff98);
  }
  return;
}

Assistant:

void RuntimeContextInfo::EnqueueNewFunctionBodyObject(Js::RecyclableObject* parent, Js::FunctionBody* fbody, const char16* name)
    {
        if(!this->m_coreBodyToPathMap.ContainsKey(fbody))
        {
            fbody->EnsureDeserialized();
            const UtilSupport::TTAutoString* ppath = this->m_coreObjToPathMap.Item(parent);

            UtilSupport::TTAutoString* fpath = TT_HEAP_NEW(UtilSupport::TTAutoString, *ppath);

            fpath->Append(_u("."));
            fpath->Append(name);

            this->m_coreBodyToPathMap.AddNew(fbody, fpath);
        }
    }